

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityPrintNumberByStyle(_U_SINT number,UNITY_DISPLAY_STYLE_T style)

{
  UNITY_DISPLAY_STYLE_T style_local;
  _U_SINT number_local;
  
  if ((style & 0x10) == 0x10) {
    UnityPrintNumber(number);
  }
  else if ((style & 0x20) == 0x20) {
    UnityPrintNumberUnsigned(number & UnitySizeMask[((ulong)style & 0xf) - 1]);
  }
  else {
    UnityPrintNumberHex(number,(char)((style & 0xf) << 1));
  }
  return;
}

Assistant:

void UnityPrintNumberByStyle(const _U_SINT number, const UNITY_DISPLAY_STYLE_T style)
{
    if ((style & UNITY_DISPLAY_RANGE_INT) == UNITY_DISPLAY_RANGE_INT)
    {
        UnityPrintNumber(number);
    }
    else if ((style & UNITY_DISPLAY_RANGE_UINT) == UNITY_DISPLAY_RANGE_UINT)
    {
        UnityPrintNumberUnsigned(  (_U_UINT)number  &  UnitySizeMask[((_U_UINT)style & (_U_UINT)0x0F) - 1]  );
    }
    else
    {
        UnityPrintNumberHex((_U_UINT)number, (char)((style & 0x000F) << 1));
    }
}